

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O1

bool Gps2Mjd(SATTIME GPST,MJDTIME *MJD)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = GPST.SOW;
  iVar2 = GPST.Week;
  if (-1 < iVar2 && 0.0 <= dVar3) {
    iVar1 = iVar2 * 7 + 0xacd4;
    MJD->Day = iVar1;
    dVar4 = ((double)(iVar2 * 7) + (dVar3 + 19.0) / 86400.0 + 44244.0 + -0.00042824074074074075) -
            (double)iVar1;
    MJD->FracDay = dVar4;
    if (1.0 <= dVar4) {
      MJD->Day = iVar1 + (int)dVar4;
      MJD->FracDay = dVar4 - (double)(int)dVar4;
    }
  }
  return -1 < iVar2 && 0.0 <= dVar3;
}

Assistant:

bool Gps2Mjd(const SATTIME GPST, MJDTIME &MJD)
{
    bool flag = isLegal(GPST);
    if(!flag)
        return flag;
    int LeapSec = 37;
    double DayofLeapSec = 37.0 / 24.0 / 3600.0;

    MJD.Day = GPST.Week * 7 + 44244;
    MJD.FracDay = (GPST.SOW + 19) / 86400.0 + 44244 + GPST.Week * 7 - DayofLeapSec - MJD.Day;
    if(MJD.FracDay >= 1)
    {
        MJD.Day += int(MJD.FracDay);
        MJD.FracDay -= int(MJD.FracDay);
    }

    return true;
}